

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUSettings.cpp
# Opt level: O0

bool __thiscall
RTIMUSettings::discoverHumidity(RTIMUSettings *this,int *humidityType,uchar *humidityAddress)

{
  bool bVar1;
  uchar local_29;
  uchar *puStack_28;
  uchar result;
  uchar *humidityAddress_local;
  int *humidityType_local;
  RTIMUSettings *this_local;
  
  puStack_28 = humidityAddress;
  humidityAddress_local = (uchar *)humidityType;
  humidityType_local = (int *)this;
  bVar1 = RTIMUHal::HALOpen(&this->super_RTIMUHal);
  if (bVar1) {
    bVar1 = RTIMUHal::HALRead(&this->super_RTIMUHal,'_','\x0f','\x01',&local_29,"");
    if ((bVar1) && (local_29 == 0xbc)) {
      humidityAddress_local[0] = '\x02';
      humidityAddress_local[1] = '\0';
      humidityAddress_local[2] = '\0';
      humidityAddress_local[3] = '\0';
      *puStack_28 = '_';
      printf("%s","Detected HTS221 at standard address\n");
      fflush(_stdout);
      return true;
    }
    bVar1 = RTIMUHal::HALRead(&this->super_RTIMUHal,'@',0xe7,'\x01',&local_29,"");
    if (bVar1) {
      humidityAddress_local[0] = '\x03';
      humidityAddress_local[1] = '\0';
      humidityAddress_local[2] = '\0';
      humidityAddress_local[3] = '\0';
      *puStack_28 = '@';
      printf("%s","Detected HTU21D at standard address\n");
      fflush(_stdout);
      return true;
    }
  }
  fprintf(_stderr,"No humidity sensor detected\n");
  return false;
}

Assistant:

bool RTIMUSettings::discoverHumidity(int& humidityType, unsigned char& humidityAddress)
{
    unsigned char result;

    //  auto detect on current bus

    if (HALOpen()) {

        if (HALRead(HTS221_ADDRESS, HTS221_REG_ID, 1, &result, "")) {
            if (result == HTS221_ID) {
                humidityType = RTHUMIDITY_TYPE_HTS221;
                humidityAddress = HTS221_ADDRESS;
                HAL_INFO("Detected HTS221 at standard address\n");
                return true;
            }
        }

        if (HALRead(HTU21D_ADDRESS, HTU21D_READ_USER_REG, 1, &result, "")) {
            humidityType = RTHUMIDITY_TYPE_HTU21D;
            humidityAddress = HTU21D_ADDRESS;
            HAL_INFO("Detected HTU21D at standard address\n");
            return true;
        }

    }
    HAL_ERROR("No humidity sensor detected\n");
    return false;
}